

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

StringRef __thiscall llvm::StringRef::rtrim(StringRef *this,char Char)

{
  size_t sVar1;
  StringRef SVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  unsigned_long local_a8;
  char local_99;
  StringRef *pSStack_98;
  char Char_local;
  StringRef *this_local;
  ulong local_80;
  StringRef *local_78;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  StringRef *local_48;
  StringRef *local_18;
  StringRef *local_10;
  
  sVar1 = this->Length;
  local_99 = Char;
  pSStack_98 = this;
  sVar3 = find_last_not_of(this,Char,0xffffffffffffffff);
  local_a8 = sVar3 + 1;
  puVar4 = std::min<unsigned_long>(&this->Length,&local_a8);
  local_80 = sVar1 - *puVar4;
  local_78 = this;
  local_10 = this;
  if (this->Length < local_80) {
    __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                  ,0x28f,"StringRef llvm::StringRef::drop_back(size_t) const");
  }
  local_58 = this->Length - local_80;
  local_50 = 0;
  local_48 = this;
  local_18 = this;
  puVar4 = std::min<unsigned_long>(&local_50,&this->Length);
  local_50 = *puVar4;
  pcVar5 = this->Data + local_50;
  local_60 = this->Length - local_50;
  puVar4 = std::min<unsigned_long>(&local_58,&local_60);
  SVar2.Length = *puVar4;
  SVar2.Data = pcVar5;
  return SVar2;
}

Assistant:

LLVM_NODISCARD
    StringRef rtrim(char Char) const {
      return drop_back(Length - std::min(Length, find_last_not_of(Char) + 1));
    }